

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateFeatureDescriptions
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar3;
  reference pFVar4;
  FeatureDescription *output;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1_1;
  FeatureDescription *input;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  string local_78;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  ModelDescription *pMStack_18;
  int modelVersion_local;
  ModelDescription *interface_local;
  Result *r;
  
  local_1c = modelVersion;
  pMStack_18 = interface;
  interface_local = (ModelDescription *)__return_storage_ptr__;
  iVar2 = Specification::ModelDescription::input_size(interface);
  if (iVar2 < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Models must have one or more inputs.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    iVar2 = Specification::ModelDescription::output_size(pMStack_18);
    if (iVar2 < 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Models must have one or more outputs.",
                 (allocator<char> *)((long)&__range1 + 7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    }
    else {
      pRVar3 = Specification::ModelDescription::input(pMStack_18);
      __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                         (pRVar3);
      input = (FeatureDescription *)
              google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                        (pRVar3);
      while (bVar1 = google::protobuf::internal::
                     RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::
                     operator!=(&__end1,(iterator *)&input), bVar1) {
        pFVar4 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                           (&__end1);
        validateFeatureDescription(__return_storage_ptr__,pFVar4,local_1c,true);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        Result::~Result(__return_storage_ptr__);
        google::protobuf::internal::
        RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end1);
      }
      pRVar3 = Specification::ModelDescription::output(pMStack_18);
      __end1_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                 begin(pRVar3);
      output = (FeatureDescription *)
               google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                         (pRVar3);
      while (bVar1 = google::protobuf::internal::
                     RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::
                     operator!=(&__end1_1,(iterator *)&output), bVar1) {
        pFVar4 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                           (&__end1_1);
        validateFeatureDescription(__return_storage_ptr__,pFVar4,local_1c,false);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        Result::~Result(__return_storage_ptr__);
        google::protobuf::internal::
        RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end1_1);
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescriptions(const Specification::ModelDescription& interface, int modelVersion) {
        // a model must have at least one input and one output
        if (interface.input_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more inputs.");
        }
        if (interface.output_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more outputs.");
        }

        for (const auto& input : interface.input()) {
            Result r = validateFeatureDescription(input, modelVersion, true);
            if (!r.good()) { return r; }
        }

        for (const auto& output : interface.output()) {
            Result r = validateFeatureDescription(output, modelVersion, false);
            if (!r.good()) { return r; }
        }

        // If we got here, all inputs/outputs seem good independently of each other.
        return Result();
    }